

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  EXRChannelInfo *pEVar5;
  int *piVar6;
  int *piVar7;
  pointer p_Var8;
  long lVar9;
  long lVar10;
  pointer p_Var11;
  pointer paVar12;
  size_t c;
  ulong uVar13;
  char *__dest;
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  exr_header->display_window[0] = info->display_window[0];
  exr_header->display_window[1] = info->display_window[1];
  exr_header->display_window[2] = info->display_window[2];
  exr_header->display_window[3] = info->display_window[3];
  exr_header->data_window[0] = info->data_window[0];
  exr_header->data_window[1] = info->data_window[1];
  exr_header->data_window[2] = info->data_window[2];
  exr_header->data_window[3] = info->data_window[3];
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar1 = info->tile_size_y;
  iVar2 = info->tile_level_mode;
  iVar3 = info->tile_rounding_mode;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = iVar1;
  exr_header->tile_level_mode = iVar2;
  exr_header->tile_rounding_mode = iVar3;
  paVar12 = (info->channels).
            super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = ((long)(info->channels).
                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)paVar12) / 0x30;
  exr_header->num_channels = (int)uVar4;
  pEVar5 = (EXRChannelInfo *)malloc((long)(int)uVar4 * 0x110);
  exr_header->channels = pEVar5;
  lVar10 = 0;
  lVar9 = 0;
  for (uVar13 = 0; uVar4 = (ulong)(int)uVar4, uVar13 < uVar4; uVar13 = uVar13 + 1) {
    strncpy(pEVar5->name + lVar10,*(char **)((long)&(paVar12->name)._M_dataplus + lVar9),0xff);
    exr_header->channels->name[lVar10 + 0xff] = '\0';
    paVar12 = (info->channels).
              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar5 = exr_header->channels;
    *(undefined4 *)((long)&pEVar5->pixel_type + lVar10) =
         *(undefined4 *)((long)&paVar12->pixel_type + lVar9);
    (&pEVar5->p_linear)[lVar10] = (&paVar12->p_linear)[lVar9];
    *(undefined8 *)((long)&pEVar5->x_sampling + lVar10) =
         *(undefined8 *)((long)&paVar12->x_sampling + lVar9);
    uVar4 = (ulong)(uint)exr_header->num_channels;
    lVar9 = lVar9 + 0x30;
    lVar10 = lVar10 + 0x110;
  }
  piVar6 = (int *)malloc(uVar4 * 4);
  exr_header->pixel_types = piVar6;
  piVar7 = &((info->channels).
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_start)->pixel_type;
  for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
    piVar6[uVar13] = *piVar7;
    piVar7 = piVar7 + 0xc;
  }
  piVar6 = (int *)malloc(uVar4 * 4);
  exr_header->requested_pixel_types = piVar6;
  piVar7 = &((info->channels).
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_start)->pixel_type;
  for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
    piVar6[uVar13] = *piVar7;
    piVar7 = piVar7 + 0xc;
  }
  p_Var11 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var8 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  exr_header->num_custom_attributes = (int)(((long)p_Var8 - (long)p_Var11) / 0x210);
  lVar9 = 0;
  for (uVar4 = 0; uVar4 < (ulong)(((long)p_Var8 - (long)p_Var11) / 0x210); uVar4 = uVar4 + 1) {
    memcpy(exr_header->custom_attributes[0].name + lVar9,p_Var11->name + lVar9,0x100);
    __dest = exr_header->custom_attributes[0].type + lVar9;
    memcpy(__dest,((info->attributes).
                   super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                   super__Vector_impl_data._M_start)->type + lVar9,0x100);
    p_Var11 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start;
    *(int *)(__dest + 0x108) = *(int *)((long)&p_Var11->size + lVar9);
    *(uchar **)(__dest + 0x100) = *(uchar **)((long)&p_Var11->value + lVar9);
    p_Var8 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar9 = lVar9 + 0x210;
  }
  exr_header->header_len = info->header_len;
  return;
}

Assistant:

static void ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window[0] = info.display_window[0];
  exr_header->display_window[1] = info.display_window[1];
  exr_header->display_window[2] = info.display_window[2];
  exr_header->display_window[3] = info.display_window[3];
  exr_header->data_window[0] = info.data_window[0];
  exr_header->data_window[1] = info.data_window[1];
  exr_header->data_window[2] = info.data_window[2];
  exr_header->data_window[3] = info.data_window[3];
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;

  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  assert(info.attributes.size() < TINYEXR_MAX_ATTRIBUTES);
  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  for (size_t i = 0; i < info.attributes.size(); i++) {
    memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name, 256);
    memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type, 256);
    exr_header->custom_attributes[i].size = info.attributes[i].size;
    // Just copy poiner
    exr_header->custom_attributes[i].value = info.attributes[i].value;
  }

  exr_header->header_len = info.header_len;
}